

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeAsyncIteratorPrototype
               (DynamicObject *asyncIteratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  undefined8 in_RAX;
  RuntimeFunction *pRVar1;
  uint uVar2;
  
  uVar2 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,asyncIteratorPrototype,mode,1,0);
  pRVar1 = DefaultCreateFunction
                     ((((asyncIteratorPrototype->super_RecyclableObject).type.ptr)->
                      javascriptLibrary).ptr,
                      (FunctionInfo *)JavascriptIterator::EntryInfo::SymbolIterator,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x2c1);
  (*(asyncIteratorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncIteratorPrototype,0x11,pRVar1,6,0,0,(ulong)uVar2 << 0x20);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncIteratorPrototype(DynamicObject* asyncIteratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(asyncIteratorPrototype, mode, 1);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterIterator
        // so that the update is in sync with profiler

        JavascriptLibrary* library = asyncIteratorPrototype->GetLibrary();

        library->AddFunctionToLibraryObjectWithName(asyncIteratorPrototype, PropertyIds::_symbolAsyncIterator, PropertyIds::_RuntimeFunctionNameId_asyncIterator,
            &JavascriptIterator::EntryInfo::SymbolIterator, 0);

        return true;
    }